

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_self_test(int verbose)

{
  int iVar1;
  undefined1 local_260 [8];
  mbedtls_mpi K;
  uchar sha1sum [20];
  uchar local_228 [8];
  uchar rsa_ciphertext [128];
  uchar rsa_decrypted [24];
  uchar local_188 [8];
  uchar rsa_plaintext [24];
  mbedtls_rsa_context rsa;
  size_t len;
  int ret;
  int verbose_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)local_260);
  mbedtls_rsa_init((mbedtls_rsa_context *)(rsa_plaintext + 0x10),0,0);
  len._4_4_ = mbedtls_mpi_read_string
                        ((mbedtls_mpi *)local_260,0x10,
                         "9292758453063D803DD603D5E777D7888ED1D5BF35786190FA2F23EBC0848AEADDA92CA6C3D80B32C4D109BE0F36D6AE7130B9CED7ACDF54CFC7555AC14EEBAB93A89813FBF3C4F8066D2D800F7C38A81AE31942917403FF4946B0A83D3D3E05EE57C6F5F5606FB5D4BC6CD34EE0801A5E94BB77B07507233A0BC7BAC8F90F79"
                        );
  if ((((((len._4_4_ == 0) &&
         (len._4_4_ = mbedtls_rsa_import((mbedtls_rsa_context *)(rsa_plaintext + 0x10),
                                         (mbedtls_mpi *)local_260,(mbedtls_mpi *)0x0,
                                         (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0),
         len._4_4_ == 0)) &&
        (len._4_4_ = mbedtls_mpi_read_string
                               ((mbedtls_mpi *)local_260,0x10,
                                "C36D0EB7FCD285223CFB5AABA5BDA3D82C01CAD19EA484A87EA4377637E75500FCB2005C5C7DD6EC4AC023CDA285D796C3D9E75E1EFC42488BB4F1D13AC30A57"
                               ), len._4_4_ == 0)) &&
       ((len._4_4_ = mbedtls_rsa_import((mbedtls_rsa_context *)(rsa_plaintext + 0x10),
                                        (mbedtls_mpi *)0x0,(mbedtls_mpi *)local_260,
                                        (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0),
        len._4_4_ == 0 &&
        (len._4_4_ = mbedtls_mpi_read_string
                               ((mbedtls_mpi *)local_260,0x10,
                                "C000DF51A7C77AE8D7C7370C1FF55B69E211C2B9E5DB1ED0BF61D0D9899620F4910E4168387E3C30AA1E00C339A795088452DD96A9A5EA5D9DCA68DA636032AF"
                               ), len._4_4_ == 0)))) &&
      ((len._4_4_ = mbedtls_rsa_import((mbedtls_rsa_context *)(rsa_plaintext + 0x10),
                                       (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                       (mbedtls_mpi *)local_260,(mbedtls_mpi *)0x0,
                                       (mbedtls_mpi *)0x0), len._4_4_ == 0 &&
       ((len._4_4_ = mbedtls_mpi_read_string
                               ((mbedtls_mpi *)local_260,0x10,
                                "24BF6185468786FDD303083D25E64EFC66CA472BC44D253102F8B4A9D3BFA75091386C0077937FE33FA3252D28855837AE1B484A8A9A45F7EE8C0C634F99E8CDDF79C5CE07EE72C7F123142198164234CABB724CF78B8173B9F880FC86322407AF1FEDFDDE2BEB674CA15F3E81A1521E071513A1E85B5DFA031F21ECAE91A34D"
                               ), len._4_4_ == 0 &&
        (len._4_4_ = mbedtls_rsa_import((mbedtls_rsa_context *)(rsa_plaintext + 0x10),
                                        (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                        (mbedtls_mpi *)local_260,(mbedtls_mpi *)0x0), len._4_4_ == 0
        )))))) &&
     ((len._4_4_ = mbedtls_mpi_read_string((mbedtls_mpi *)local_260,0x10,"10001"), len._4_4_ == 0 &&
      ((len._4_4_ = mbedtls_rsa_import((mbedtls_rsa_context *)(rsa_plaintext + 0x10),
                                       (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                       (mbedtls_mpi *)0x0,(mbedtls_mpi *)local_260), len._4_4_ == 0
       && (len._4_4_ = mbedtls_rsa_complete((mbedtls_rsa_context *)(rsa_plaintext + 0x10)),
          len._4_4_ == 0)))))) {
    if (verbose != 0) {
      printf("  RSA key validation: ");
    }
    iVar1 = mbedtls_rsa_check_pubkey((mbedtls_rsa_context *)(rsa_plaintext + 0x10));
    if ((iVar1 == 0) &&
       (iVar1 = mbedtls_rsa_check_privkey((mbedtls_rsa_context *)(rsa_plaintext + 0x10)), iVar1 == 0
       )) {
      if (verbose != 0) {
        printf("passed\n  PKCS#1 encryption : ");
      }
      local_188[0] = -0x56;
      local_188[1] = -0x45;
      local_188[2] = -0x34;
      local_188[3] = '\x03';
      local_188[4] = '\x02';
      local_188[5] = '\x01';
      local_188[6] = '\0';
      local_188[7] = -1;
      rsa_plaintext[0] = -1;
      rsa_plaintext[1] = -1;
      rsa_plaintext[2] = -1;
      rsa_plaintext[3] = -1;
      rsa_plaintext[4] = '\x11';
      rsa_plaintext[5] = '\"';
      rsa_plaintext[6] = '3';
      rsa_plaintext[7] = '\n';
      rsa_plaintext[8] = '\v';
      rsa_plaintext[9] = '\f';
      rsa_plaintext[10] = -0x34;
      rsa_plaintext[0xb] = -0x23;
      rsa_plaintext[0xc] = -0x23;
      rsa_plaintext[0xd] = -0x23;
      rsa_plaintext[0xe] = -0x23;
      rsa_plaintext[0xf] = -0x23;
      iVar1 = mbedtls_rsa_pkcs1_encrypt
                        ((mbedtls_rsa_context *)(rsa_plaintext + 0x10),myrand,(void *)0x0,0,0x18,
                         local_188,local_228);
      if (iVar1 == 0) {
        if (verbose != 0) {
          printf("passed\n  PKCS#1 decryption : ");
        }
        iVar1 = mbedtls_rsa_pkcs1_decrypt
                          ((mbedtls_rsa_context *)(rsa_plaintext + 0x10),myrand,(void *)0x0,1,
                           (size_t *)&rsa.padding,local_228,rsa_ciphertext + 0x78,0x18);
        if (iVar1 == 0) {
          iVar1 = memcmp(rsa_ciphertext + 0x78,local_188,rsa._328_8_);
          if (iVar1 == 0) {
            if (verbose != 0) {
              printf("passed\n");
              printf("  PKCS#1 data sign  : ");
            }
            iVar1 = mbedtls_sha1_ret(local_188,0x18,(uchar *)&K.p);
            if (iVar1 != 0) {
              if (verbose != 0) {
                printf("failed\n");
              }
              return 1;
            }
            iVar1 = mbedtls_rsa_pkcs1_sign
                              ((mbedtls_rsa_context *)(rsa_plaintext + 0x10),myrand,(void *)0x0,1,
                               MBEDTLS_MD_SHA1,0,(uchar *)&K.p,local_228);
            if (iVar1 == 0) {
              if (verbose != 0) {
                printf("passed\n  PKCS#1 sig. verify: ");
              }
              iVar1 = mbedtls_rsa_pkcs1_verify
                                ((mbedtls_rsa_context *)(rsa_plaintext + 0x10),
                                 (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,0,
                                 MBEDTLS_MD_SHA1,0,(uchar *)&K.p,local_228);
              if (iVar1 == 0) {
                if (verbose != 0) {
                  printf("passed\n");
                  printf(anon_var_dwarf_f9c3 + 8);
                }
              }
              else {
                if (verbose != 0) {
                  printf("failed\n");
                }
                len._4_4_ = 1;
              }
            }
            else {
              if (verbose != 0) {
                printf("failed\n");
              }
              len._4_4_ = 1;
            }
          }
          else {
            if (verbose != 0) {
              printf("failed\n");
            }
            len._4_4_ = 1;
          }
        }
        else {
          if (verbose != 0) {
            printf("failed\n");
          }
          len._4_4_ = 1;
        }
      }
      else {
        if (verbose != 0) {
          printf("failed\n");
        }
        len._4_4_ = 1;
      }
    }
    else {
      if (verbose != 0) {
        printf("failed\n");
      }
      len._4_4_ = 1;
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_260);
  mbedtls_rsa_free((mbedtls_rsa_context *)(rsa_plaintext + 0x10));
  return len._4_4_;
}

Assistant:

int mbedtls_rsa_self_test( int verbose )
{
    int ret = 0;
#if defined(MBEDTLS_PKCS1_V15)
    size_t len;
    mbedtls_rsa_context rsa;
    unsigned char rsa_plaintext[PT_LEN];
    unsigned char rsa_decrypted[PT_LEN];
    unsigned char rsa_ciphertext[KEY_LEN];
#if defined(MBEDTLS_SHA1_C)
    unsigned char sha1sum[20];
#endif

    mbedtls_mpi K;

    mbedtls_mpi_init( &K );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_N  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, &K, NULL, NULL, NULL, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_P  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, NULL, &K, NULL, NULL, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_Q  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, NULL, NULL, &K, NULL, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_D  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, NULL, NULL, NULL, &K, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_E  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, NULL, NULL, NULL, NULL, &K ) );

    MBEDTLS_MPI_CHK( mbedtls_rsa_complete( &rsa ) );

    if( verbose != 0 )
        mbedtls_printf( "  RSA key validation: " );

    if( mbedtls_rsa_check_pubkey(  &rsa ) != 0 ||
        mbedtls_rsa_check_privkey( &rsa ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  PKCS#1 encryption : " );

    memcpy( rsa_plaintext, RSA_PT, PT_LEN );

    if( mbedtls_rsa_pkcs1_encrypt( &rsa, myrand, NULL, MBEDTLS_RSA_PUBLIC,
                                   PT_LEN, rsa_plaintext,
                                   rsa_ciphertext ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  PKCS#1 decryption : " );

    if( mbedtls_rsa_pkcs1_decrypt( &rsa, myrand, NULL, MBEDTLS_RSA_PRIVATE,
                                   &len, rsa_ciphertext, rsa_decrypted,
                                   sizeof(rsa_decrypted) ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( memcmp( rsa_decrypted, rsa_plaintext, len ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

#if defined(MBEDTLS_SHA1_C)
    if( verbose != 0 )
        mbedtls_printf( "  PKCS#1 data sign  : " );

    if( mbedtls_sha1_ret( rsa_plaintext, PT_LEN, sha1sum ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( 1 );
    }

    if( mbedtls_rsa_pkcs1_sign( &rsa, myrand, NULL,
                                MBEDTLS_RSA_PRIVATE, MBEDTLS_MD_SHA1, 0,
                                sha1sum, rsa_ciphertext ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  PKCS#1 sig. verify: " );

    if( mbedtls_rsa_pkcs1_verify( &rsa, NULL, NULL,
                                  MBEDTLS_RSA_PUBLIC, MBEDTLS_MD_SHA1, 0,
                                  sha1sum, rsa_ciphertext ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );
#endif /* MBEDTLS_SHA1_C */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

cleanup:
    mbedtls_mpi_free( &K );
    mbedtls_rsa_free( &rsa );
#else /* MBEDTLS_PKCS1_V15 */
    ((void) verbose);
#endif /* MBEDTLS_PKCS1_V15 */
    return( ret );
}